

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O2

void __thiscall
ValidationSignals::ChainStateFlushed
          (ValidationSignals *this,ChainstateRole role,CBlockLocator *locator)

{
  CBlockLocator *this_00;
  base_blob<256u> *this_01;
  unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_> uVar1;
  bool bVar2;
  undefined8 *puVar3;
  CBlockLocator *pCVar4;
  CBlockLocator *category;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  char *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  allocator<char> local_b1;
  char *local_name;
  anon_class_40_3_58e176f4_for_event event;
  undefined1 local_80 [32];
  undefined4 local_60 [2];
  vector<uint256,_std::allocator<uint256>_> local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &event.locator;
  pCVar4 = locator;
  category = this_00;
  event.role = role;
  std::vector<uint256,_std::allocator<uint256>_>::vector(&this_00->vHave,&locator->vHave);
  local_name = "ChainStateFlushed";
  event.this = this;
  bVar2 = ::LogAcceptCategory((LogFlags)category,(Level)pCVar4);
  local_80._0_8_ = "ChainStateFlushed";
  if (bVar2) {
    this_01 = (base_blob<256u> *)
              (locator->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (this_01 ==
        (base_blob<256u> *)
        (locator->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"null",&local_b1);
    }
    else {
      base_blob<256u>::ToString_abi_cxx11_((string *)local_80,this_01);
    }
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validationinterface.cpp"
    ;
    source_file._M_len = 0x60;
    logging_function._M_str = "ChainStateFlushed";
    logging_function._M_len = 0x11;
    LogPrintf_<char_const*,std::__cxx11::string>
              (logging_function,source_file,0xceba44,(LogFlags)&local_name,(Level)local_80,
               in_stack_ffffffffffffff20,(char **)in_stack_ffffffffffffff28,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff30);
    std::__cxx11::string::~string((string *)local_80);
    local_80._0_8_ = local_name;
  }
  uVar1._M_t.
  super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>.
  _M_t.
  super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
  .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl =
       (((this->m_internals)._M_t.
         super___uniq_ptr_impl<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>.
         _M_t.
         super__Tuple_impl<0UL,_ValidationSignalsImpl_*,_std::default_delete<ValidationSignalsImpl>_>
         .super__Head_base<0UL,_ValidationSignalsImpl_*,_false>._M_head_impl)->m_task_runner)._M_t;
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)(local_80 + 8),&locator->vHave);
  ChainStateFlushed(ChainstateRole,CBlockLocator_const&)::$_1::__1((__1 *)local_60,&event);
  puVar3 = (undefined8 *)operator_new(0x48);
  *puVar3 = local_80._0_8_;
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)(puVar3 + 1),
             (vector<uint256,_std::allocator<uint256>_> *)(local_80 + 8));
  *(undefined4 *)(puVar3 + 4) = local_60[0];
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)(puVar3 + 5),&local_58);
  puVar3[8] = local_40;
  (**(code **)(*(long *)uVar1._M_t.
                        super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                        .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl +
              0x10))(uVar1._M_t.
                     super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                     .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff28);
  ChainStateFlushed(ChainstateRole,CBlockLocator_const&)::$_0::~__0((__0 *)local_80);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            ((_Vector_base<uint256,_std::allocator<uint256>_> *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::ChainStateFlushed(ChainstateRole role, const CBlockLocator &locator) {
    auto event = [role, locator, this] {
        m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.ChainStateFlushed(role, locator); });
    };
    ENQUEUE_AND_LOG_EVENT(event, "%s: block hash=%s", __func__,
                          locator.IsNull() ? "null" : locator.vHave.front().ToString());
}